

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int getch(void)

{
  int iVar1;
  undefined1 local_84 [8];
  termios newt;
  termios oldt;
  int ch;
  
  tcgetattr(0,(termios *)&newt.c_ispeed);
  memcpy(local_84,&newt.c_ispeed,0x3c);
  newt.c_oflag = newt.c_oflag & 0xfffffff5;
  tcsetattr(0,0,(termios *)local_84);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&newt.c_ispeed);
  return iVar1;
}

Assistant:

int getch()

{

    int ch;

    struct termios oldt, newt;

    tcgetattr( STDIN_FILENO, &oldt );

    newt = oldt;

    newt.c_lflag &= ~( ICANON | ECHO );

    tcsetattr( STDIN_FILENO, TCSANOW, &newt );

    ch = getchar();

    tcsetattr( STDIN_FILENO, TCSANOW, &oldt );

    return ch;

}